

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O2

LinkedList<data_structures::SymbolTableElement<int,_int>_> * __thiscall
data_structures::LinkedList<data_structures::SymbolTableElement<int,_int>_>::operator=
          (LinkedList<data_structures::SymbolTableElement<int,_int>_> *this,
          LinkedList<data_structures::SymbolTableElement<int,_int>_> *list)

{
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar1;
  
  pLVar1 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
  pLVar1->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010bbd8;
  (pLVar1->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010bc08;
  pLVar1->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  this->_header = pLVar1;
  this->_tail = pLVar1;
  this->_size = 0;
  pLVar1 = list->_header;
  while (list->_tail != pLVar1) {
    pLVar1 = pLVar1->_next;
    insertToTail(this,&pLVar1->element);
  }
  return this;
}

Assistant:

inline
    LinkedList<T>& LinkedList<T>::operator=(const LinkedList<T>& list) {
        _header = new ListNode<T>();
        _tail = _header;
        _size = 0;
        ListNode<T>* _current = list._header;
        while (!list.isTail(_current)) {
            _current = _current->next();
            insertToTail(_current->element);
        }
        return *this;
    }